

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void cfd::js::api::json::UpdateTxInSequenceRequest::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>_>_>,_bool>
  pVar2;
  allocator local_369;
  string local_368 [32];
  _Base_ptr local_348;
  undefined1 local_340;
  undefined1 local_338 [64];
  function<std::__cxx11::string()> local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  undefined1 local_2a0 [64];
  function<std::__cxx11::string()> local_260 [39];
  allocator local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined1 local_208 [64];
  function<std::__cxx11::string()> local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  undefined1 local_170 [64];
  function<std::__cxx11::string()> local_130 [39];
  allocator local_109;
  string local_108 [32];
  _Base_ptr local_e8;
  undefined1 local_e0;
  undefined1 local_c8 [64];
  function<std::__cxx11::string()> local_88 [32];
  undefined1 local_68 [8];
  CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> func_table;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>_>_>_>
                   *)json_mapper_abi_cxx11_);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_68);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxInSequenceRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>
                *)local_c8,GetTxString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)> *)
               (local_c8 + 0x20),SetTxString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_88,GetTxFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_c8);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_c8);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
            ::
            emplace<char_const(&)[3],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [3])"tx",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)
                       local_68);
    local_e8 = (_Base_ptr)pVar2.first._M_node;
    local_e0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"tx",&local_109);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxInSequenceRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>
                *)local_170,GetIsElementsString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)> *)
               (local_170 + 0x20),SetIsElementsString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_130,GetIsElementsFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_170);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_170);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
            ::
            emplace<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [11])"isElements",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)
                       local_68);
    local_180 = (_Base_ptr)pVar2.first._M_node;
    local_178 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"isElements",&local_1a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxInSequenceRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>
                *)local_208,GetTxidString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)> *)
               (local_208 + 0x20),SetTxidString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_1c8,GetTxidFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_208);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_208);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [5])0x17ea844,
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)
                       local_68);
    local_218 = (_Base_ptr)pVar2.first._M_node;
    local_210 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"txid",&local_239);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_238);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxInSequenceRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>
                *)local_2a0,GetVoutString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)> *)
               (local_2a0 + 0x20),SetVoutString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_260,GetVoutFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_2a0);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_2a0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [5])"vout",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)
                       local_68);
    local_2b0 = (_Base_ptr)pVar2.first._M_node;
    local_2a8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"vout",&local_2d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_2d0);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    std::function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::UpdateTxInSequenceRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::UpdateTxInSequenceRequest_const&)>
                *)local_338,GetSequenceString_abi_cxx11_);
    std::function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::UpdateTxInSequenceRequest&,UniValue_const&)> *)
               (local_338 + 0x20),SetSequenceString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_2f8,GetSequenceFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_338);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_338);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [9])"sequence",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)
                       local_68);
    local_348 = (_Base_ptr)pVar2.first._M_node;
    local_340 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"sequence",&local_369);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_368);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::UpdateTxInSequenceRequest> *)local_68);
  }
  return;
}

Assistant:

void UpdateTxInSequenceRequest::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<UpdateTxInSequenceRequest> func_table;  // NOLINT

  func_table = {
    UpdateTxInSequenceRequest::GetTxString,
    UpdateTxInSequenceRequest::SetTxString,
    UpdateTxInSequenceRequest::GetTxFieldType,
  };
  json_mapper.emplace("tx", func_table);
  item_list.push_back("tx");
  func_table = {
    UpdateTxInSequenceRequest::GetIsElementsString,
    UpdateTxInSequenceRequest::SetIsElementsString,
    UpdateTxInSequenceRequest::GetIsElementsFieldType,
  };
  json_mapper.emplace("isElements", func_table);
  item_list.push_back("isElements");
  func_table = {
    UpdateTxInSequenceRequest::GetTxidString,
    UpdateTxInSequenceRequest::SetTxidString,
    UpdateTxInSequenceRequest::GetTxidFieldType,
  };
  json_mapper.emplace("txid", func_table);
  item_list.push_back("txid");
  func_table = {
    UpdateTxInSequenceRequest::GetVoutString,
    UpdateTxInSequenceRequest::SetVoutString,
    UpdateTxInSequenceRequest::GetVoutFieldType,
  };
  json_mapper.emplace("vout", func_table);
  item_list.push_back("vout");
  func_table = {
    UpdateTxInSequenceRequest::GetSequenceString,
    UpdateTxInSequenceRequest::SetSequenceString,
    UpdateTxInSequenceRequest::GetSequenceFieldType,
  };
  json_mapper.emplace("sequence", func_table);
  item_list.push_back("sequence");
}